

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

vector<Pathie::Path,_std::allocator<Pathie::Path>_> * __thiscall
Pathie::Path::entries
          (vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,Path *this)

{
  bool bVar1;
  Path *__x;
  entry_iterator local_60;
  undefined1 local_38 [8];
  entry_iterator iter;
  Path *this_local;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> *results;
  
  iter.mp_cur_path._7_1_ = 0;
  std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::vector(__return_storage_ptr__);
  begin_entries((entry_iterator *)local_38,this);
  while( true ) {
    end_entries(&local_60,this);
    bVar1 = entry_iterator::operator!=((entry_iterator *)local_38,&local_60);
    entry_iterator::~entry_iterator(&local_60);
    if (!bVar1) break;
    __x = entry_iterator::operator*((entry_iterator *)local_38);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back(__return_storage_ptr__,__x);
    entry_iterator::operator++((entry_iterator *)local_38,0);
  }
  entry_iterator::~entry_iterator((entry_iterator *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Path> Path::entries() const
{
  std::vector<Path> results;
  for(entry_iterator iter=begin_entries(); iter != end_entries(); iter++) {
    results.push_back(*iter);
  }

  return results;
}